

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_image.cc
# Opt level: O3

void __thiscall InputImage::InputImage(InputImage *this,char *filename)

{
  int *piVar1;
  istream *this_00;
  Complex *pCVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float real;
  ifstream ifs;
  float local_254;
  Complex local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    this_00 = (istream *)std::istream::operator>>((istream *)local_238,&this->w);
    piVar1 = &this->h;
    std::istream::operator>>(this_00,piVar1);
    uVar8 = (ulong)this->h;
    lVar6 = (long)this->w * uVar8;
    uVar7 = lVar6 * 8;
    iVar5 = (int)lVar6;
    uVar9 = 0xffffffffffffffff;
    if (-1 < iVar5) {
      uVar9 = uVar7;
    }
    pCVar2 = (Complex *)operator_new__(uVar9);
    if (iVar5 != 0) {
      uVar9 = 0;
      do {
        Complex::Complex((Complex *)((long)&pCVar2->real + uVar9));
        uVar9 = uVar9 + 8;
      } while (uVar7 != uVar9);
      uVar8 = (ulong)(uint)*piVar1;
    }
    this->data = pCVar2;
    if (0 < (int)uVar8) {
      iVar5 = this->w;
      iVar4 = 0;
      do {
        if (0 < iVar5) {
          lVar6 = 0;
          do {
            std::istream::_M_extract<float>((float *)local_238);
            Complex::Complex(&local_240,local_254);
            this->data[(long)this->w * (long)iVar4 + lVar6] = local_240;
            iVar5 = this->w;
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 < iVar5);
          uVar8 = (ulong)(uint)*piVar1;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < (int)uVar8);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Can\'t open image file ",0x16);
  poVar3 = std::operator<<((ostream *)&std::cout,filename);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

InputImage::InputImage(const char* filename) {
    std::ifstream ifs(filename);
    if(!ifs) {
        std::cout << "Can't open image file " << filename << std::endl;
        exit(1);
    }

    ifs >> w >> h;
    data = new Complex[w * h];
    for(int r = 0; r < h; ++r) {
        for(int c = 0; c < w; ++c) {
            float real;
            ifs >> real;
            data[r * w + c] = Complex(real);
        }
    }
}